

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffhist(fitsfile **fptr,char *outfile,int imagetype,int naxis,char (*colname) [71],double *minin,
          double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
          char (*binname) [71],double weightin,char *wtcol,int recip,char *selectrow,int *status)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  double dVar5;
  char *local_620;
  char *cptr;
  char cpref [4] [71];
  double local_4f0;
  double dvalue;
  char svalue [71];
  double local_498;
  double datamax;
  double datamin;
  double maxbin [4];
  double binsize [4];
  double amax [4];
  double amin [4];
  undefined1 local_400 [8];
  histType histData;
  long n_per_loop;
  long offset;
  int nkeys;
  int n_cols;
  iteratorCol imagepars [1];
  tcolumn *colptr;
  char card [81];
  char local_138 [8];
  char keyname [75];
  char errmsg [81];
  fitsfile *histptr;
  long haxes [4];
  int local_60;
  int use_datamax;
  int tstatus;
  int bitpix;
  int ibin;
  int imax;
  int imin;
  int repeat;
  int datatype;
  int ii;
  double weightin_local;
  double *minin_local;
  char (*colname_local) [71];
  int naxis_local;
  int imagetype_local;
  char *outfile_local;
  fitsfile **fptr_local;
  
  haxes[3]._4_4_ = 0;
  offset._4_4_ = 1;
  histData.infos = (parseInfo *)0xffffffffffffffff;
  datamax = -9.1191291391491e-36;
  local_498 = -9.1191291391491e-36;
  if (*status < 1) {
    _datatype = (char *)weightin;
    weightin_local = (double)minin;
    minin_local = (double *)colname;
    colname_local._0_4_ = naxis;
    colname_local._4_4_ = imagetype;
    _naxis_local = outfile;
    outfile_local = (char *)fptr;
    if (naxis < 5) {
      if ((*fptr)->HDUposition != (*fptr)->Fptr->curhdu) {
        ffmahd(*fptr,(*fptr)->HDUposition + 1,(int *)0x0,status);
      }
      histData.hist.b = *outfile_local;
      histData.hcolnum[2] = colname_local._4_4_;
      histData.tblptr._0_4_ = (int)colname_local;
      histData.weight = (double)selectrow;
      if (colname_local._4_4_ == 0xb) {
        use_datamax = 8;
      }
      else if (colname_local._4_4_ == 0x15) {
        use_datamax = 0x10;
      }
      else if (colname_local._4_4_ == 0x1f) {
        use_datamax = 0x20;
      }
      else if (colname_local._4_4_ == 0x2a) {
        use_datamax = -0x20;
      }
      else {
        if (colname_local._4_4_ != 0x52) {
          *status = 0x19a;
          return 0x19a;
        }
        use_datamax = -0x40;
      }
      local_60 = 0;
      ffgky(*(fitsfile **)outfile_local,0x10,"CPREF",&cptr,(char *)0x0,&local_60);
      if (local_60 == 0) {
        local_620 = (char *)&cptr;
        while( true ) {
          bVar4 = false;
          if (*local_620 != ',') {
            bVar4 = *local_620 != '\0';
          }
          if (!bVar4) break;
          local_620 = (char *)((long)local_620 + 1);
        }
        if (*local_620 != '\0') {
          *local_620 = '\0';
          do {
            local_620 = (char *)((long)local_620 + 1);
          } while (*local_620 == ' ');
          strcpy(cpref[0] + 0x3f,local_620);
          local_620 = cpref[0] + 0x3f;
          while( true ) {
            bVar4 = false;
            if (*local_620 != ',') {
              bVar4 = *local_620 != '\0';
            }
            if (!bVar4) break;
            local_620 = local_620 + 1;
          }
          if (*local_620 != '\0') {
            *local_620 = '\0';
            do {
              local_620 = local_620 + 1;
            } while (*local_620 == ' ');
            strcpy(cpref[1] + 0x3f,local_620);
            local_620 = cpref[1] + 0x3f;
            while( true ) {
              bVar4 = false;
              if (*local_620 != ',') {
                bVar4 = *local_620 != '\0';
              }
              if (!bVar4) break;
              local_620 = local_620 + 1;
            }
            if (*local_620 != '\0') {
              *local_620 = '\0';
              do {
                local_620 = local_620 + 1;
              } while (*local_620 == ' ');
              strcpy(cpref[2] + 0x3f,local_620);
            }
          }
        }
      }
      for (repeat = 0; repeat < (int)colname_local; repeat = repeat + 1) {
        if ((minname[repeat][0] != '\0') &&
           (iVar1 = ffgky(*(fitsfile **)outfile_local,0x52,minname[repeat],
                          (void *)((long)weightin_local + (long)repeat * 8),(char *)0x0,status),
           iVar1 != 0)) {
          ffpmsg("error reading histogramming minimum keyword");
          ffpmsg(minname[repeat]);
          return *status;
        }
        if ((maxname[repeat][0] != '\0') &&
           (iVar1 = ffgky(*(fitsfile **)outfile_local,0x52,maxname[repeat],maxin + repeat,
                          (char *)0x0,status), iVar1 != 0)) {
          ffpmsg("error reading histogramming maximum keyword");
          ffpmsg(maxname[repeat]);
          return *status;
        }
        if ((binname[repeat][0] != '\0') &&
           (iVar1 = ffgky(*(fitsfile **)outfile_local,0x52,binname[repeat],binsizein + repeat,
                          (char *)0x0,status), iVar1 != 0)) {
          ffpmsg("error reading histogramming binsize keyword");
          ffpmsg(binname[repeat]);
          return *status;
        }
        if ((binsizein[repeat] == 0.0) && (!NAN(binsizein[repeat]))) {
          ffpmsg("error: histogram binsize = 0");
          *status = 0x142;
          return 0x142;
        }
        if ((*(char *)((long)minin_local + (long)repeat * 0x47) == '\0') &&
           (strcpy((char *)((long)minin_local + (long)repeat * 0x47),cpref[(long)repeat + -1] + 0x3f
                  ), *(char *)((long)minin_local + (long)repeat * 0x47) == '\0')) {
          if (repeat == 0) {
            strcpy((char *)minin_local,"X");
          }
          else if (repeat == 1) {
            strcpy((char *)((long)minin_local + 0x47),"Y");
          }
          else if (repeat == 2) {
            strcpy((char *)((long)minin_local + 0x8e),"Z");
          }
          else if (repeat == 3) {
            strcpy((char *)((long)minin_local + 0xd5),"T");
          }
        }
        iVar1 = ffgcno(*(fitsfile **)outfile_local,0,
                       (char *)((long)minin_local + (long)repeat * 0x47),
                       histData.hcolnum + (long)repeat + -2,status);
        if (0 < iVar1) {
          strcpy(keyname + 0x48,"column for histogram axis doesn\'t exist: ");
          pcVar2 = (char *)((long)minin_local + (long)repeat * 0x47);
          sVar3 = strlen(keyname + 0x48);
          strncat(keyname + 0x48,pcVar2,0x50 - sVar3);
          ffpmsg(keyname + 0x48);
          return *status;
        }
        imax = (int)*(undefined8 *)
                     (*(long *)(*(long *)(*(long *)outfile_local + 8) + 0x3d0) +
                      (long)(histData.hcolnum[(long)repeat + -2] + -1) * 0xa0 + 0x58);
        if (1 < imax) {
          strcpy(keyname + 0x48,"Can\'t bin a vector column: ");
          pcVar2 = (char *)((long)minin_local + (long)repeat * 0x47);
          sVar3 = strlen(keyname + 0x48);
          strncat(keyname + 0x48,pcVar2,0x50 - sVar3);
          ffpmsg(keyname + 0x48);
          *status = 0x19a;
          return 0x19a;
        }
        ffeqty(*(fitsfile **)outfile_local,histData.hcolnum[(long)repeat + -2],&imin,(long *)0x0,
               (long *)0x0,status);
        if ((imin < 0) || (imin == 0x10)) {
          strcpy(keyname + 0x48,"Inappropriate datatype; can\'t bin this column: ");
          pcVar2 = (char *)((long)minin_local + (long)repeat * 0x47);
          sVar3 = strlen(keyname + 0x48);
          strncat(keyname + 0x48,pcVar2,0x50 - sVar3);
          ffpmsg(keyname + 0x48);
          *status = 0x19a;
          return 0x19a;
        }
        dVar5 = *(double *)((long)weightin_local + (long)repeat * 8);
        if ((dVar5 != -9.1191291391491e-36) || (NAN(dVar5))) {
          amax[(long)repeat + 3] = *(double *)((long)weightin_local + (long)repeat * 8);
        }
        else {
          ffkeyn("TLMIN",histData.hcolnum[(long)repeat + -2],local_138,status);
          iVar1 = ffgky(*(fitsfile **)outfile_local,0x52,local_138,amax + (long)repeat + 3,
                        (char *)0x0,status);
          if (0 < iVar1) {
            *status = 0;
            iVar1 = fits_get_col_minmax(*(fitsfile **)outfile_local,
                                        histData.hcolnum[(long)repeat + -2],amax + (long)repeat + 3,
                                        &local_498,status);
            if (0 < iVar1) {
              strcpy(keyname + 0x48,"Error calculating datamin and datamax for column: ");
              pcVar2 = (char *)((long)minin_local + (long)repeat * 0x47);
              sVar3 = strlen(keyname + 0x48);
              strncat(keyname + 0x48,pcVar2,0x50 - sVar3);
              ffpmsg(keyname + 0x48);
              return *status;
            }
          }
        }
        if ((maxin[repeat] != -9.1191291391491e-36) || (NAN(maxin[repeat]))) {
          binsize[(long)repeat + 3] = maxin[repeat];
        }
        else {
          ffkeyn("TLMAX",histData.hcolnum[(long)repeat + -2],local_138,status);
          iVar1 = ffgky(*(fitsfile **)outfile_local,0x52,local_138,binsize + (long)repeat + 3,
                        (char *)0x0,status);
          if (0 < iVar1) {
            *status = 0;
            if ((local_498 != -9.1191291391491e-36) || (NAN(local_498))) {
              binsize[(long)repeat + 3] = local_498;
            }
            else {
              iVar1 = fits_get_col_minmax(*(fitsfile **)outfile_local,
                                          histData.hcolnum[(long)repeat + -2],&datamax,
                                          binsize + (long)repeat + 3,status);
              if (0 < iVar1) {
                strcpy(keyname + 0x48,"Error calculating datamin and datamax for column: ");
                pcVar2 = (char *)((long)minin_local + (long)repeat * 0x47);
                sVar3 = strlen(keyname + 0x48);
                strncat(keyname + 0x48,pcVar2,0x50 - sVar3);
                ffpmsg(keyname + 0x48);
                return *status;
              }
            }
          }
          haxes[3]._4_4_ = 1;
        }
        if ((binsizein[repeat] == -9.1191291391491e-36) && (!NAN(binsizein[repeat]))) {
          local_60 = 0;
          ffkeyn("TDBIN",histData.hcolnum[(long)repeat + -2],local_138,&local_60);
          iVar1 = ffgky(*(fitsfile **)outfile_local,0x52,local_138,binsizein + repeat,(char *)0x0,
                        &local_60);
          if ((0 < iVar1) &&
             (binsizein[repeat] = (binsize[(long)repeat + 3] - amax[(long)repeat + 3]) / 10.0,
             1.0 < binsizein[repeat])) {
            binsizein[repeat] = 1.0;
          }
        }
        if (((binsize[(long)repeat + 3] <= amax[(long)repeat + 3] &&
              amax[(long)repeat + 3] != binsize[(long)repeat + 3]) && (0.0 < binsizein[repeat])) ||
           ((amax[(long)repeat + 3] < binsize[(long)repeat + 3] &&
            (binsizein[repeat] <= 0.0 && binsizein[repeat] != 0.0)))) {
          maxbin[(long)repeat + 3] = -binsizein[repeat];
        }
        else {
          maxbin[(long)repeat + 3] = binsizein[repeat];
        }
        tstatus = (int)maxbin[(long)repeat + 3];
        ibin = (int)amax[(long)repeat + 3];
        bitpix = (int)binsize[(long)repeat + 3];
        if (((((0x29 < imin) || ((double)ibin != amax[(long)repeat + 3])) ||
             (NAN((double)ibin) || NAN(amax[(long)repeat + 3]))) ||
            (((double)bitpix != binsize[(long)repeat + 3] ||
             (NAN((double)bitpix) || NAN(binsize[(long)repeat + 3]))))) ||
           (((double)tstatus != maxbin[(long)repeat + 3] ||
            (NAN((double)tstatus) || NAN(maxbin[(long)repeat + 3]))))) {
          if (haxes[3]._4_4_ == 0) {
            maxbin[(long)repeat + -1] =
                 (binsize[(long)repeat + 3] - amax[(long)repeat + 3]) / maxbin[(long)repeat + 3];
            haxes[(long)repeat + -1] = (long)maxbin[(long)repeat + -1];
            if (binsize[(long)repeat + 3] <= amax[(long)repeat + 3]) {
              dVar5 = (double)haxes[(long)repeat + -1] * maxbin[(long)repeat + 3] +
                      amax[(long)repeat + 3];
              if (binsize[(long)repeat + 3] <= dVar5 && dVar5 != binsize[(long)repeat + 3]) {
                haxes[(long)repeat + -1] = haxes[(long)repeat + -1] + 1;
              }
            }
            else if ((double)haxes[(long)repeat + -1] * maxbin[(long)repeat + 3] +
                     amax[(long)repeat + 3] < binsize[(long)repeat + 3]) {
              haxes[(long)repeat + -1] = haxes[(long)repeat + -1] + 1;
            }
          }
          else {
            maxbin[(long)repeat + -1] =
                 (binsize[(long)repeat + 3] - amax[(long)repeat + 3]) / maxbin[(long)repeat + 3];
            haxes[(long)repeat + -1] = (long)(maxbin[(long)repeat + -1] + 1.0);
          }
        }
        else {
          haxes[(long)repeat + -1] = (long)((bitpix - ibin) / tstatus + 1);
          maxbin[(long)repeat + -1] = (double)haxes[(long)repeat + -1] + 1.0;
          if (binsize[(long)repeat + 3] <= amax[(long)repeat + 3]) {
            amax[(long)repeat + 3] = amax[(long)repeat + 3] + 0.5;
            binsize[(long)repeat + 3] = binsize[(long)repeat + 3] - 0.5;
          }
          else {
            amax[(long)repeat + 3] = amax[(long)repeat + 3] - 0.5;
            binsize[(long)repeat + 3] = binsize[(long)repeat + 3] + 0.5;
          }
        }
      }
      if (*wtcol == '\0') {
        histData.wtexpr = _datatype;
      }
      else {
        iVar1 = ffgky(*(fitsfile **)outfile_local,0x52,wtcol,&histData.wtexpr,(char *)0x0,status);
        if (iVar1 != 0) {
          *status = 0;
          iVar1 = ffgcno(*(fitsfile **)outfile_local,0,wtcol,(int *)((long)histData.incr + 0x24),
                         status);
          if (0 < iVar1) {
            ffpmsg("keyword or column for histogram weights doesn\'t exist: ");
            ffpmsg(wtcol);
            return *status;
          }
          histData.wtexpr = (char *)0xb8a83e285ebab4b7;
        }
      }
      if ((0.0 < (double)histData.wtexpr) ||
         (((double)histData.wtexpr == -9.1191291391491e-36 && (!NAN((double)histData.wtexpr))))) {
        if ((recip != 0) &&
           (((double)histData.wtexpr != -9.1191291391491e-36 || (NAN((double)histData.wtexpr))))) {
          histData.wtexpr = (char *)(1.0 / (double)histData.wtexpr);
        }
        histData.incr[4]._0_4_ = recip;
        iVar1 = ffinit((fitsfile **)(errmsg + 0x50),_naxis_local,status);
        if (iVar1 < 1) {
          iVar1 = ffcrim(stack0xffffffffffffff70,use_datamax,(int)histData.tblptr,(long *)&histptr,
                         status);
          if (iVar1 < 1) {
            ffghsp(*(fitsfile **)outfile_local,(int *)&offset,(int *)0x0,status);
            for (repeat = 1; repeat <= (int)offset; repeat = repeat + 1) {
              ffgrec(*(fitsfile **)outfile_local,repeat,(char *)&colptr,status);
              iVar1 = ffgkcl((char *)&colptr);
              if (0x77 < iVar1) {
                ffprec(stack0xffffffffffffff70,(char *)&colptr,status);
              }
            }
            histData.haxis4 = (long)amax[3];
            histData.amin4 = datamin;
            histData.maxbin4 = maxbin[3];
            histData._32_8_ = histptr;
            if (1 < (int)histData.tblptr) {
              histData.maxbin1 = maxbin[0];
              histData.binsize1 = binsize[0];
              histData.haxis1 = haxes[0];
              if (2 < (int)histData.tblptr) {
                histData.maxbin2 = maxbin[1];
                histData.binsize2 = binsize[1];
                histData.haxis2 = haxes[1];
                if (3 < (int)histData.tblptr) {
                  histData.maxbin3 = maxbin[2];
                  histData.binsize3 = binsize[2];
                  histData.haxis3 = haxes[2];
                }
              }
            }
            fits_iter_set_file((iteratorCol *)&nkeys,stack0xffffffffffffff70);
            fits_iter_set_datatype((iteratorCol *)&nkeys,colname_local._4_4_);
            fits_iter_set_iotype((iteratorCol *)&nkeys,2);
            iVar1 = ffiter(offset._4_4_,(iteratorCol *)&nkeys,0,(long)histData.infos,ffwritehisto,
                           local_400,status);
            if (iVar1 == 0) {
              for (repeat = 0; repeat < (int)histData.tblptr; repeat = repeat + 1) {
                local_60 = 0;
                ffkeyn("TCTYP",histData.hcolnum[(long)repeat + -2],local_138,&local_60);
                ffgky(*(fitsfile **)outfile_local,0x10,local_138,&dvalue,(char *)0x0,&local_60);
                if (local_60 != 0) {
                  local_60 = 0;
                  ffkeyn("TTYPE",histData.hcolnum[(long)repeat + -2],local_138,&local_60);
                  ffgky(*(fitsfile **)outfile_local,0x10,local_138,&dvalue,(char *)0x0,&local_60);
                }
                if (local_60 == 0) {
                  ffkeyn("CTYPE",repeat + 1,local_138,&local_60);
                  ffpky(stack0xffffffffffffff70,0x10,local_138,&dvalue,"Coordinate Type",&local_60);
                }
                else {
                  local_60 = 0;
                }
                ffkeyn("TCUNI",histData.hcolnum[(long)repeat + -2],local_138,&local_60);
                ffgky(*(fitsfile **)outfile_local,0x10,local_138,&dvalue,(char *)0x0,&local_60);
                if (local_60 != 0) {
                  local_60 = 0;
                  ffkeyn("TUNIT",histData.hcolnum[(long)repeat + -2],local_138,&local_60);
                  ffgky(*(fitsfile **)outfile_local,0x10,local_138,&dvalue,(char *)0x0,&local_60);
                }
                if (local_60 == 0) {
                  ffkeyn("CUNIT",repeat + 1,local_138,&local_60);
                  ffpky(stack0xffffffffffffff70,0x10,local_138,&dvalue,"Coordinate Units",&local_60)
                  ;
                }
                else {
                  local_60 = 0;
                }
                ffkeyn("TCRPX",histData.hcolnum[(long)repeat + -2],local_138,&local_60);
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)0x0,&local_60);
                if (local_60 == 0) {
                  local_4f0 = (local_4f0 - amax[(long)repeat + 3]) / maxbin[(long)repeat + 3] + 0.5;
                }
                else {
                  local_4f0 = 1.0;
                  local_60 = 0;
                }
                ffkeyn("CRPIX",repeat + 1,local_138,&local_60);
                ffpky(stack0xffffffffffffff70,0x52,local_138,&local_4f0,"Reference Pixel",&local_60)
                ;
                ffkeyn("TCRVL",histData.hcolnum[(long)repeat + -2],local_138,&local_60);
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)0x0,&local_60);
                if (local_60 != 0) {
                  local_4f0 = amax[(long)repeat + 3] + maxbin[(long)repeat + 3] / 2.0;
                  local_60 = 0;
                }
                ffkeyn("CRVAL",repeat + 1,local_138,&local_60);
                ffpky(stack0xffffffffffffff70,0x52,local_138,&local_4f0,"Reference Value",&local_60)
                ;
                ffkeyn("TCDLT",histData.hcolnum[(long)repeat + -2],local_138,&local_60);
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)0x0,&local_60);
                if (local_60 != 0) {
                  local_4f0 = 1.0;
                  local_60 = 0;
                }
                local_4f0 = local_4f0 * maxbin[(long)repeat + 3];
                ffkeyn("CDELT",repeat + 1,local_138,&local_60);
                ffpky(stack0xffffffffffffff70,0x52,local_138,&local_4f0,"Pixel size",&local_60);
                if (repeat == 1) {
                  ffkeyn("TCROT",histData.haxis,local_138,&local_60);
                  ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)0x0,&local_60)
                  ;
                  if ((local_60 == 0) && ((local_4f0 != 0.0 || (NAN(local_4f0))))) {
                    ffkeyn("CROTA",repeat + 1,local_138,&local_60);
                    ffpky(stack0xffffffffffffff70,0x52,local_138,&local_4f0,"Rotation angle",
                          &local_60);
                  }
                  else {
                    local_60 = 0;
                    ffkeyn("TCROT",histData.tblptr._4_4_,local_138,&local_60);
                    ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)0x0,
                          &local_60);
                    if ((local_60 == 0) && ((local_4f0 != 0.0 || (NAN(local_4f0))))) {
                      local_4f0 = local_4f0 * -1.0;
                      ffkeyn("CROTA",repeat + 1,local_138,&local_60);
                      ffpky(stack0xffffffffffffff70,0x52,local_138,&local_4f0,"Rotation angle",
                            &local_60);
                    }
                  }
                }
              }
              if ((int)histData.tblptr == 2) {
                local_60 = 0;
                ffkeyn("TP",histData.tblptr._4_4_,(char *)&colptr,&local_60);
                strcat((char *)&colptr,"_");
                ffkeyn((char *)&colptr,histData.tblptr._4_4_,local_138,&local_60);
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)&colptr,
                      &local_60);
                if (local_60 == 0) {
                  ffpky(stack0xffffffffffffff70,0x52,"PC1_1",&local_4f0,(char *)&colptr,&local_60);
                }
                local_60 = 0;
                local_138[1] = 0x43;
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)&colptr,
                      &local_60);
                if (local_60 == 0) {
                  local_4f0 = maxbin[3] * local_4f0;
                  ffpky(stack0xffffffffffffff70,0x52,"CD1_1",&local_4f0,(char *)&colptr,&local_60);
                }
                local_60 = 0;
                ffkeyn("TP",histData.tblptr._4_4_,(char *)&colptr,&local_60);
                strcat((char *)&colptr,"_");
                ffkeyn((char *)&colptr,histData.haxis,local_138,&local_60);
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)&colptr,
                      &local_60);
                if (local_60 == 0) {
                  ffpky(stack0xffffffffffffff70,0x52,"PC1_2",&local_4f0,(char *)&colptr,&local_60);
                }
                local_60 = 0;
                local_138[1] = 0x43;
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)&colptr,
                      &local_60);
                if (local_60 == 0) {
                  local_4f0 = maxbin[3] * local_4f0;
                  ffpky(stack0xffffffffffffff70,0x52,"CD1_2",&local_4f0,(char *)&colptr,&local_60);
                }
                local_60 = 0;
                ffkeyn("TP",histData.haxis,(char *)&colptr,&local_60);
                strcat((char *)&colptr,"_");
                ffkeyn((char *)&colptr,histData.tblptr._4_4_,local_138,&local_60);
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)&colptr,
                      &local_60);
                if (local_60 == 0) {
                  ffpky(stack0xffffffffffffff70,0x52,"PC2_1",&local_4f0,(char *)&colptr,&local_60);
                }
                local_60 = 0;
                local_138[1] = 0x43;
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)&colptr,
                      &local_60);
                if (local_60 == 0) {
                  local_4f0 = binsize[0] * local_4f0;
                  ffpky(stack0xffffffffffffff70,0x52,"CD2_1",&local_4f0,(char *)&colptr,&local_60);
                }
                local_60 = 0;
                ffkeyn("TP",histData.haxis,(char *)&colptr,&local_60);
                strcat((char *)&colptr,"_");
                ffkeyn((char *)&colptr,histData.haxis,local_138,&local_60);
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)&colptr,
                      &local_60);
                if (local_60 == 0) {
                  ffpky(stack0xffffffffffffff70,0x52,"PC2_2",&local_4f0,(char *)&colptr,&local_60);
                }
                local_60 = 0;
                local_138[1] = 0x43;
                ffgky(*(fitsfile **)outfile_local,0x52,local_138,&local_4f0,(char *)&colptr,
                      &local_60);
                if (local_60 == 0) {
                  local_4f0 = binsize[0] * local_4f0;
                  ffpky(stack0xffffffffffffff70,0x52,"CD2_2",&local_4f0,(char *)&colptr,&local_60);
                }
              }
              ffclos(*(fitsfile **)outfile_local,status);
              *(fitsfile **)outfile_local = stack0xffffffffffffff70;
              fptr_local._4_4_ = *status;
            }
            else {
              fptr_local._4_4_ = *status;
            }
          }
          else {
            ffpmsg("failed to create primary array histogram in temp file");
            ffclos(stack0xffffffffffffff70,status);
            fptr_local._4_4_ = *status;
          }
        }
        else {
          ffpmsg("failed to create temp output file for histogram");
          fptr_local._4_4_ = *status;
        }
      }
      else {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
        *status = 0x7d;
        fptr_local._4_4_ = 0x7d;
      }
    }
    else {
      ffpmsg("histogram has more than 4 dimensions");
      *status = 0x140;
      fptr_local._4_4_ = 0x140;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffhist(fitsfile **fptr,  /* IO - pointer to table with X and Y cols;    */
                             /*     on output, points to histogram image    */
           char *outfile,    /* I - name for the output histogram file      */
           int imagetype,    /* I - datatype for image: TINT, TSHORT, etc   */
           int naxis,        /* I - number of axes in the histogram image   */
           char colname[4][FLEN_VALUE],   /* I - column names               */
           double *minin,     /* I - minimum histogram value, for each axis */
           double *maxin,     /* I - maximum histogram value, for each axis */
           double *binsizein, /* I - bin size along each axis               */
           char minname[4][FLEN_VALUE], /* I - optional keywords for min    */
           char maxname[4][FLEN_VALUE], /* I - optional keywords for max    */
           char binname[4][FLEN_VALUE], /* I - optional keywords for binsize */
           double weightin,        /* I - binning weighting factor          */
           char wtcol[FLEN_VALUE], /* I - optional keyword or col for weight*/
           int recip,              /* I - use reciprocal of the weight?     */
           char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
           int *status)
{
    int ii, datatype, repeat, imin, imax, ibin, bitpix, tstatus, use_datamax = 0;
    long haxes[4];
    fitsfile *histptr;
    char errmsg[FLEN_ERRMSG], keyname[FLEN_KEYWORD], card[FLEN_CARD];
    tcolumn *colptr;
    iteratorCol imagepars[1];
    int n_cols = 1, nkeys;
    long  offset = 0;
    long n_per_loop = -1;  /* force whole array to be passed at one time */
    histType histData;    /* Structure holding histogram info for iterator */
    
    double amin[4], amax[4], binsize[4], maxbin[4];
    double datamin = DOUBLENULLVALUE, datamax = DOUBLENULLVALUE;
    char svalue[FLEN_VALUE];
    double dvalue;
    char cpref[4][FLEN_VALUE];
    char *cptr;

    if (*status > 0)
        return(*status);

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if ((*fptr)->HDUposition != ((*fptr)->Fptr)->curhdu)
        ffmahd(*fptr, ((*fptr)->HDUposition) + 1, NULL, status);

    histData.tblptr     = *fptr;
    histData.himagetype = imagetype;
    histData.haxis      = naxis;
    histData.rowselector = selectrow;

    if (imagetype == TBYTE)
        bitpix = BYTE_IMG;
    else if (imagetype == TSHORT)
        bitpix = SHORT_IMG;
    else if (imagetype == TINT)
        bitpix = LONG_IMG;
    else if (imagetype == TFLOAT)
        bitpix = FLOAT_IMG;
    else if (imagetype == TDOUBLE)
        bitpix = DOUBLE_IMG;
    else
        return(*status = BAD_DATATYPE);

    /* The CPREF keyword, if it exists, gives the preferred columns. */
    /* Otherwise, assume "X", "Y", "Z", and "T"  */

    tstatus = 0;
    ffgky(*fptr, TSTRING, "CPREF", cpref[0], NULL, &tstatus);

    if (!tstatus)
    {
        /* Preferred column names are given;  separate them */
        cptr = cpref[0];

        /* the first preferred axis... */
        while (*cptr != ',' && *cptr != '\0')
           cptr++;

        if (*cptr != '\0')
        {
           *cptr = '\0';
           cptr++;
           while (*cptr == ' ')
               cptr++;

           strcpy(cpref[1], cptr);
           cptr = cpref[1];

          /* the second preferred axis... */
          while (*cptr != ',' && *cptr != '\0')
             cptr++;

          if (*cptr != '\0')
          {
             *cptr = '\0';
             cptr++;
             while (*cptr == ' ')
                 cptr++;

             strcpy(cpref[2], cptr);
             cptr = cpref[2];

            /* the third preferred axis... */
            while (*cptr != ',' && *cptr != '\0')
               cptr++;

            if (*cptr != '\0')
            {
               *cptr = '\0';
               cptr++;
               while (*cptr == ' ')
                   cptr++;

               strcpy(cpref[3], cptr);

            }
          }
        }
    }

    for (ii = 0; ii < naxis; ii++)
    {

      /* get the min, max, and binsize values from keywords, if specified */

      if (*minname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, minname[ii], &minin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming minimum keyword");
             ffpmsg(minname[ii]);
             return(*status);
         }
      }

      if (*maxname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, maxname[ii], &maxin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming maximum keyword");
             ffpmsg(maxname[ii]);
             return(*status);
         }
      }

      if (*binname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, binname[ii], &binsizein[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming binsize keyword");
             ffpmsg(binname[ii]);
             return(*status);
         }
      }

      if (binsizein[ii] == 0.)
      {
        ffpmsg("error: histogram binsize = 0");
        return(*status = ZERO_SCALE);
      }

      if (*colname[ii] == '\0')
      {
         strcpy(colname[ii], cpref[ii]); /* try using the preferred column */
         if (*colname[ii] == '\0')
         {
           if (ii == 0)
              strcpy(colname[ii], "X");
           else if (ii == 1)
              strcpy(colname[ii], "Y");
           else if (ii == 2)
              strcpy(colname[ii], "Z");
           else if (ii == 3)
              strcpy(colname[ii], "T");
         }
      }

      /* get the column number in the table */
      if (ffgcno(*fptr, CASEINSEN, colname[ii], histData.hcolnum+ii, status)
              > 0)
      {
        strcpy(errmsg, "column for histogram axis doesn't exist: ");
        strncat(errmsg, colname[ii], FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status);
      }

      colptr = ((*fptr)->Fptr)->tableptr;
      colptr += (histData.hcolnum[ii] - 1);

      repeat = (int) colptr->trepeat;  /* vector repeat factor of the column */
      if (repeat > 1)
      {
        strcpy(errmsg, "Can't bin a vector column: ");
        strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status = BAD_DATATYPE);
      }

      /* get the datatype of the column */
      fits_get_eqcoltype(*fptr, histData.hcolnum[ii], &datatype,
         NULL, NULL, status);

      if (datatype < 0 || datatype == TSTRING)
      {
        strcpy(errmsg, "Inappropriate datatype; can't bin this column: ");
        strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status = BAD_DATATYPE);
      }

      /* use TLMINn and TLMAXn keyword values if min and max were not given */
      /* else use actual data min and max if TLMINn and TLMAXn don't exist */
 
      if (minin[ii] == DOUBLENULLVALUE)
      {
        ffkeyn("TLMIN", histData.hcolnum[ii], keyname, status);
        if (ffgky(*fptr, TDOUBLE, keyname, amin+ii, NULL, status) > 0)
        {
            /* use actual data minimum value for the histogram minimum */
            *status = 0;
            if (fits_get_col_minmax(*fptr, histData.hcolnum[ii], amin+ii, &datamax, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                ffpmsg(errmsg);
                return(*status);
            }
         }
      }
      else
      {
        amin[ii] = (double) minin[ii];
      }

      if (maxin[ii] == DOUBLENULLVALUE)
      {
        ffkeyn("TLMAX", histData.hcolnum[ii], keyname, status);
        if (ffgky(*fptr, TDOUBLE, keyname, &amax[ii], NULL, status) > 0)
        {
          *status = 0;
          if(datamax != DOUBLENULLVALUE)  /* already computed max value */
          {
             amax[ii] = datamax;
          }
          else
          {
             /* use actual data maximum value for the histogram maximum */
             if (fits_get_col_minmax(*fptr, histData.hcolnum[ii], &datamin, &amax[ii], status) > 0)
             {
                 strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                 strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                 ffpmsg(errmsg);
                 return(*status);
             }
          }
        }
        use_datamax = 1;  /* flag that the max was determined by the data values */
                          /* and not specifically set by the calling program */
      }
      else
      {
        amax[ii] = (double) maxin[ii];
      }

      /* use TDBINn keyword or else 1 if bin size is not given */
      if (binsizein[ii] == DOUBLENULLVALUE)
      {
         tstatus = 0;
         ffkeyn("TDBIN", histData.hcolnum[ii], keyname, &tstatus);

         if (ffgky(*fptr, TDOUBLE, keyname, binsizein + ii, NULL, &tstatus) > 0)
         {
	    /* make at least 10 bins */
            binsizein[ii] = (amax[ii] - amin[ii]) / 10. ;
            if (binsizein[ii] > 1.)
                binsizein[ii] = 1.;  /* use default bin size */
         }
      }

      if ( (amin[ii] > amax[ii] && binsizein[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsizein[ii] < 0. ) )
          binsize[ii] = (double) -binsizein[ii];  /* reverse the sign of binsize */
      else
          binsize[ii] =  (double) binsizein[ii];  /* binsize has the correct sign */

      ibin = (int) binsize[ii];
      imin = (int) amin[ii];
      imax = (int) amax[ii];

      /* Determine the range and number of bins in the histogram. This  */
      /* depends on whether the input columns are integer or floats, so */
      /* treat each case separately.                                    */

      if (datatype <= TLONG && (double) imin == amin[ii] &&
 	                       (double) imax == amax[ii] &&
                               (double) ibin == binsize[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        haxes[ii] = (imax - imin) / ibin + 1;  /* last bin may only */
                                               /* be partially full */
        maxbin[ii] = (double) (haxes[ii] + 1.);  /* add 1. instead of .5 to avoid roundoff */

        if (amin[ii] < amax[ii])
        {
          amin[ii] = (double) (amin[ii] - 0.5);
          amax[ii] = (double) (amax[ii] + 0.5);
        }
        else
        {
          amin[ii] = (double) (amin[ii] + 0.5);
          amax[ii] = (double) (amax[ii] - 0.5);
        }
      }
      else if (use_datamax)  
      {
        /* Either the column datatype and/or the limits are floating point, */
        /* and the histogram limits are being defined by the min and max */
        /* values of the array.  Add 1 to the number of histogram bins to */
        /* make sure that pixels that are equal to the maximum or are */
        /* in the last partial bin are included.  */

        maxbin[ii] = (amax[ii] - amin[ii]) / binsize[ii]; 
        haxes[ii] = (long) (maxbin[ii] + 1);
      }
      else  
      {
        /*  float datatype column and/or limits, and the maximum value to */
        /*  include in the histogram is specified by the calling program. */
        /*  The lower limit is inclusive, but upper limit is exclusive    */
        maxbin[ii] = (amax[ii] - amin[ii]) / binsize[ii];
        haxes[ii] = (long) maxbin[ii];

        if (amin[ii] < amax[ii])
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) < amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
        else
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) > amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
      }
    }

       /* get the histogramming weighting factor */
    if (*wtcol)
    {
        /* first, look for a keyword with the weight value */
        if (ffgky(*fptr, TDOUBLE, wtcol, &histData.weight, NULL, status) )
        {
            /* not a keyword, so look for column with this name */
            *status = 0;

            /* get the column number in the table */
            if (ffgcno(*fptr, CASEINSEN, wtcol, &histData.wtcolnum, status) > 0)
            {
               ffpmsg(
               "keyword or column for histogram weights doesn't exist: ");
               ffpmsg(wtcol);
               return(*status);
            }

            histData.weight = DOUBLENULLVALUE;
        }
    }
    else
        histData.weight = (double) weightin;

    if (histData.weight <= 0. && histData.weight != DOUBLENULLVALUE)
    {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
        return(*status = URL_PARSE_ERROR);
    }

    if (recip && histData.weight != DOUBLENULLVALUE)
       /* take reciprocal of weight */
       histData.weight = (double) (1.0 / histData.weight);

    histData.wtrecip = recip;
        
    /* size of histogram is now known, so create temp output file */
    if (ffinit(&histptr, outfile, status) > 0)
    {
        ffpmsg("failed to create temp output file for histogram");
        return(*status);
    }

    if (ffcrim(histptr, bitpix, histData.haxis, haxes, status) > 0)
    {
        ffpmsg("failed to create primary array histogram in temp file");
        ffclos(histptr, status);
        return(*status);
    }

    /* copy all non-structural keywords from the table to the image */
    fits_get_hdrspace(*fptr, &nkeys, NULL, status);
    for (ii = 1; ii <= nkeys; ii++)
    {
       fits_read_record(*fptr, ii, card, status);
       if (fits_get_keyclass(card) >= 120)
           fits_write_record(histptr, card, status);
    }           

    /* Set global variables with histogram parameter values.    */
    /* Use separate scalar variables rather than arrays because */
    /* it is more efficient when computing the histogram.       */

    histData.amin1 = amin[0];
    histData.maxbin1 = maxbin[0];
    histData.binsize1 = binsize[0];
    histData.haxis1 = haxes[0];

    if (histData.haxis > 1)
    {
      histData.amin2 = amin[1];
      histData.maxbin2 = maxbin[1];
      histData.binsize2 = binsize[1];
      histData.haxis2 = haxes[1];

      if (histData.haxis > 2)
      {
        histData.amin3 = amin[2];
        histData.maxbin3 = maxbin[2];
        histData.binsize3 = binsize[2];
        histData.haxis3 = haxes[2];

        if (histData.haxis > 3)
        {
          histData.amin4 = amin[3];
          histData.maxbin4 = maxbin[3];
          histData.binsize4 = binsize[3];
          histData.haxis4 = haxes[3];
        }
      }
    }

    /* define parameters of image for the iterator function */
    fits_iter_set_file(imagepars, histptr);        /* pointer to image */
    fits_iter_set_datatype(imagepars, imagetype);  /* image datatype   */
    fits_iter_set_iotype(imagepars, OutputCol);    /* image is output  */

    /* call the iterator function to write out the histogram image */
    if (fits_iterate_data(n_cols, imagepars, offset, n_per_loop,
                          ffwritehisto, (void*)&histData, status) )
         return(*status);

    /* write the World Coordinate System (WCS) keywords */
    /* create default values if WCS keywords are not present in the table */
    for (ii = 0; ii < histData.haxis; ii++)
    {
     /*  CTYPEn  */
       tstatus = 0;
       ffkeyn("TCTYP", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       if (tstatus)
       {               /* just use column name as the type */
          tstatus = 0;
          ffkeyn("TTYPE", histData.hcolnum[ii], keyname, &tstatus);
          ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       }

       if (!tstatus)
       {
        ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
        ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Type", &tstatus);
       }
       else
          tstatus = 0;

     /*  CUNITn  */
       ffkeyn("TCUNI", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       if (tstatus)
       {         /* use the column units */
          tstatus = 0;
          ffkeyn("TUNIT", histData.hcolnum[ii], keyname, &tstatus);
          ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       }

       if (!tstatus)
       {
        ffkeyn("CUNIT", ii + 1, keyname, &tstatus);
        ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Units", &tstatus);
       }
       else
         tstatus = 0;

     /*  CRPIXn  - Reference Pixel  */
       ffkeyn("TCRPX", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         dvalue = 1.0; /* choose first pixel in new image as ref. pix. */
         tstatus = 0;
       }
       else
       {
           /* calculate locate of the ref. pix. in the new image */
           dvalue = (dvalue - amin[ii]) / binsize[ii] + .5;
       }

       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Pixel", &tstatus);

     /*  CRVALn - Value at the location of the reference pixel */
       ffkeyn("TCRVL", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         /* calculate value at ref. pix. location (at center of 1st pixel) */
         dvalue = amin[ii] + binsize[ii]/2.;
         tstatus = 0;
       }

       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Value", &tstatus);

     /*  CDELTn - unit size of pixels  */
       ffkeyn("TCDLT", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         dvalue = 1.0;  /* use default pixel size */
         tstatus = 0;
       }

       dvalue = dvalue * binsize[ii];
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Pixel size", &tstatus);

     /*  CROTAn - Rotation angle (degrees CCW)  */
     /*  There should only be a CROTA2 keyword, and only for 2+ D images */
       if (ii == 1)
       {
         ffkeyn("TCROT", histData.hcolnum[ii], keyname, &tstatus);
         ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
         if (!tstatus && dvalue != 0.)  /* only write keyword if angle != 0 */
         {
           ffkeyn("CROTA", ii + 1, keyname, &tstatus);
           ffpky(histptr, TDOUBLE, keyname, &dvalue,
                 "Rotation angle", &tstatus);
         }
         else
         {
            /* didn't find CROTA for the 2nd axis, so look for one */
            /* on the first axis */
           tstatus = 0;
           ffkeyn("TCROT", histData.hcolnum[0], keyname, &tstatus);
           ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
           if (!tstatus && dvalue != 0.)  /* only write keyword if angle != 0 */
           {
             dvalue *= -1.;   /* negate the value, because mirror image */
             ffkeyn("CROTA", ii + 1, keyname, &tstatus);
             ffpky(histptr, TDOUBLE, keyname, &dvalue,
                   "Rotation angle", &tstatus);
           }
         }
       }
    }

    /* convert any TPn_k keywords to PCi_j; the value remains unchanged */
    /* also convert any TCn_k to CDi_j; the value is modified by n binning size */
    /* This is a bit of a kludge, and only works for 2D WCS */

    if (histData.haxis == 2) {

      /* PC1_1 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[0], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[0], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC1_1", &dvalue, card, &tstatus);

      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[0];
         ffpky(histptr, TDOUBLE, "CD1_1", &dvalue, card, &tstatus);
      }

      /* PC1_2 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[0], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[1], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC1_2", &dvalue, card, &tstatus);
 
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
        dvalue *=  binsize[0];
        ffpky(histptr, TDOUBLE, "CD1_2", &dvalue, card, &tstatus);
      }
       
      /* PC2_1 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[1], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[0], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC2_1", &dvalue, card, &tstatus);
 
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[1];
         ffpky(histptr, TDOUBLE, "CD2_1", &dvalue, card, &tstatus);
      }
       
       /* PC2_2 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[1], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[1], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC2_2", &dvalue, card, &tstatus);
        
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[1];
         ffpky(histptr, TDOUBLE, "CD2_2", &dvalue, card, &tstatus);
      }
    }   
       
    /* finally, close the original file and return ptr to the new image */
    ffclos(*fptr, status);
    *fptr = histptr;

    return(*status);
}